

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

int mdns_socket_setup_ipv6(int sock)

{
  int iVar1;
  uint uVar2;
  uint loopback;
  int hops;
  ipv6_mreq req;
  sockaddr_in6 saddr;
  
  saddr.sin6_scope_id = 0;
  saddr.sin6_family = 10;
  saddr.sin6_port = 0;
  saddr.sin6_flowinfo = 0;
  saddr.sin6_addr.__in6_u.__u6_addr32[0] = (uint32_t)_in6addr_any;
  saddr.sin6_addr.__in6_u.__u6_addr32[1] = (uint32_t)((ulong)_in6addr_any >> 0x20);
  saddr.sin6_addr.__in6_u.__u6_addr32[2] = (uint32_t)_poll;
  saddr.sin6_addr.__in6_u.__u6_addr32[3] = (uint32_t)((ulong)_poll >> 0x20);
  iVar1 = bind(sock,(sockaddr *)&saddr,0x1c);
  if (iVar1 == 0) {
    uVar2 = fcntl(sock,3,0);
    fcntl(sock,4,(ulong)(uVar2 | 0x800));
    loopback = 1;
    hops = loopback;
    setsockopt(sock,0x29,0x12,&hops,4);
    setsockopt(sock,0x29,0x13,&loopback,4);
    req.ipv6mr_interface = 0;
    req.ipv6mr_multiaddr.__in6_u._0_8_ = 0x2ff;
    req.ipv6mr_multiaddr.__in6_u._8_8_ = 0xfb00000000000000;
    iVar1 = setsockopt(sock,0x29,0x14,&req,0x14);
    iVar1 = -(uint)(iVar1 != 0);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
mdns_socket_setup_ipv6(int sock) {
	struct sockaddr_in6 saddr;
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin6_family = AF_INET6;
	saddr.sin6_addr = in6addr_any;
#ifdef __APPLE__
	saddr.sin6_len = sizeof(saddr);
#endif

	if (bind(sock, (struct sockaddr*)&saddr, sizeof(saddr)))
		return -1;

#ifdef _WIN32
	unsigned long param = 1;
	ioctlsocket(sock, FIONBIO, &param);
#else
	const int flags = fcntl(sock, F_GETFL, 0);
	fcntl(sock, F_SETFL, flags | O_NONBLOCK);
#endif

	int hops = 1;
	unsigned int loopback = 1;
	struct ipv6_mreq req;

	setsockopt(sock, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, (const char*)&hops, sizeof(hops));
	setsockopt(sock, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, (const char*)&loopback, sizeof(loopback));

	memset(&req, 0, sizeof(req));
	req.ipv6mr_multiaddr.s6_addr[0] = 0xFF;
	req.ipv6mr_multiaddr.s6_addr[1] = 0x02;
	req.ipv6mr_multiaddr.s6_addr[15] = 0xFB;
	if (setsockopt(sock, IPPROTO_IPV6, IPV6_JOIN_GROUP, (char*)&req, sizeof(req)))
		return -1;

	return 0;
}